

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::class_<Neyn::Config>::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  void **ppvVar2;
  void *pvVar3;
  instance *piVar4;
  byte bVar5;
  error_scope scope;
  error_scope local_30;
  
  PyErr_Fetch(&local_30,&local_30.value,&local_30.trace);
  bVar5 = v_h->inst->field_0x30;
  if ((bVar5 & 2) == 0) {
    bVar5 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar5 = bVar5 >> 2;
  }
  ppvVar2 = v_h->vh;
  if ((bVar5 & 1) == 0) {
    operator_delete(*ppvVar2);
  }
  else {
    pvVar3 = ppvVar2[1];
    if (pvVar3 != (void *)0x0) {
      if (*(void **)((long)pvVar3 + 8) != (void *)((long)pvVar3 + 0x18)) {
        operator_delete(*(void **)((long)pvVar3 + 8));
      }
      operator_delete(pvVar3);
    }
    ppvVar2[1] = (void *)0x0;
    piVar4 = v_h->inst;
    if ((piVar4->field_0x30 & 2) == 0) {
      pbVar1 = (piVar4->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar4->field_0x30 = piVar4->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope(&local_30);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }